

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UBool anon_unknown.dwarf_28b9ff::isNoInheritanceMarker(ResourceData *pResData,Resource res)

{
  uint uVar1;
  int *piVar2;
  bool local_47;
  bool local_46;
  bool local_45;
  uint16_t *puStack_40;
  int32_t first;
  UChar *p_1;
  UChar *p;
  int32_t length;
  int32_t *p32;
  uint32_t offset;
  Resource res_local;
  ResourceData *pResData_local;
  
  uVar1 = res & 0xfffffff;
  if (uVar1 != 0) {
    if (res == uVar1) {
      piVar2 = pResData->pRoot + res;
      local_45 = false;
      if (((*piVar2 == 3) && (local_45 = false, (short)piVar2[1] == 0x2205)) &&
         (local_45 = false, *(short *)((long)piVar2 + 6) == 0x2205)) {
        local_45 = (short)piVar2[2] == 0x2205;
      }
      return local_45;
    }
    if (res >> 0x1c == 6) {
      if ((int)uVar1 < pResData->poolStringIndexLimit) {
        puStack_40 = pResData->poolBundleStrings + uVar1;
      }
      else {
        puStack_40 = pResData->p16BitUnits + (uVar1 - pResData->poolStringIndexLimit);
      }
      if (*puStack_40 == 0x2205) {
        local_46 = false;
        if ((puStack_40[1] == 0x2205) && (local_46 = false, puStack_40[2] == 0x2205)) {
          local_46 = puStack_40[3] == 0;
        }
        return local_46;
      }
      if (*puStack_40 == 0xdc03) {
        local_47 = false;
        if ((puStack_40[1] == 0x2205) && (local_47 = false, puStack_40[2] == 0x2205)) {
          local_47 = puStack_40[3] == 0x2205;
        }
        return local_47;
      }
      return '\0';
    }
  }
  return '\0';
}

Assistant:

UBool isNoInheritanceMarker(const ResourceData *pResData, Resource res) {
    uint32_t offset=RES_GET_OFFSET(res);
    if (offset == 0) {
        // empty string
    } else if (res == offset) {
        const int32_t *p32=pResData->pRoot+res;
        int32_t length=*p32;
        const UChar *p=(const UChar *)p32;
        return length == 3 && p[2] == 0x2205 && p[3] == 0x2205 && p[4] == 0x2205;
    } else if (RES_GET_TYPE(res) == URES_STRING_V2) {
        const UChar *p;
        if((int32_t)offset<pResData->poolStringIndexLimit) {
            p=(const UChar *)pResData->poolBundleStrings+offset;
        } else {
            p=(const UChar *)pResData->p16BitUnits+(offset-pResData->poolStringIndexLimit);
        }
        int32_t first=*p;
        if (first == 0x2205) {  // implicit length
            return p[1] == 0x2205 && p[2] == 0x2205 && p[3] == 0;
        } else if (first == 0xdc03) {  // explicit length 3 (should not occur)
            return p[1] == 0x2205 && p[2] == 0x2205 && p[3] == 0x2205;
        } else {
            // Assume that the string has not been stored with more length units than necessary.
            return FALSE;
        }
    }
    return FALSE;
}